

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O2

PyObject *
vecToList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::convert
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *vec)

{
  pointer pbVar1;
  list *this;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  this = (list *)operator_new(8);
  boost::python::detail::list_base::list_base((list_base *)this);
  lVar3 = 0;
  for (uVar2 = 0;
      pbVar1 = (vec->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(vec->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar2 = uVar2 + 1) {
    boost::python::list::append<std::__cxx11::string>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
    lVar3 = lVar3 + 0x20;
  }
  return (this->super_list_base).super_object.super_object_base.m_ptr;
}

Assistant:

static PyObject* convert(const std::vector<T>& vec){
        list* l = new list();
        for(size_t i = 0; i < vec.size(); i++){
            l->append(vec[i]);
        }
        return l->ptr();
    }